

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::SliceHelper<double>
               (JavascriptArray *pArr,JavascriptArray *pnewArr,uint32 start,uint32 newLen)

{
  uint index;
  uint uVar1;
  SparseArraySegmentBase *pSVar2;
  SparseArraySegmentBase *this;
  code *pcVar3;
  undefined8 this_00;
  bool bVar4;
  DynamicObjectFlags DVar5;
  int iVar6;
  undefined4 *puVar7;
  uint32 uVar8;
  ulong dstCount;
  undefined8 local_68;
  Var element;
  JsReentLock jsReentLock;
  
  element = ((((((pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.ptr)->
               javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)element)->noJsReentrancy;
  ((ThreadContext *)element)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)&element,pArr);
  pSVar2 = (pArr->head).ptr;
  this = (pnewArr->head).ptr;
  dstCount = (ulong)newLen;
  jsReentLock._24_8_ = pnewArr;
  Memory::CopyArray<double,double,Memory::Recycler>
            ((double *)(this + 1),dstCount,(double *)(&pSVar2[1].left + (ulong)start * 2),dstCount);
  this->length = newLen;
  SparseArraySegmentBase::CheckLengthvsSize(this);
  if (this->size < this->length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x185e,"(pnewHeadSeg->length <= pnewHeadSeg->size)",
                                "pnewHeadSeg->length <= pnewHeadSeg->size");
    if (!bVar4) {
LAB_00ba717b:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  DVar5 = DynamicObject::GetArrayFlags((DynamicObject *)pArr);
  this_00 = jsReentLock._24_8_;
  if ((DVar5 & HasNoMissingValues) == None) {
    if (newLen != 0) {
      uVar8 = 0;
      do {
        pSVar2 = (pArr->head).ptr;
        uVar1 = pSVar2->left;
        index = start + uVar8;
        if ((index < uVar1) || (uVar1 + pSVar2->length <= index)) break;
        bVar4 = IsMissingItem(pArr,index);
        if (bVar4) {
          DVar5 = DynamicObject::GetArrayFlags((DynamicObject *)this_00);
          DynamicObject::SetArrayFlags((DynamicObject *)this_00,DVar5 & ~HasNoMissingValues);
          *(undefined1 *)((long)element + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          iVar6 = (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x71])(pArr,(ulong)index,&local_68);
          JsReentLock::MutateArrayObject((JsReentLock *)&element);
          *(undefined1 *)((long)element + 0x108) = 1;
          if (iVar6 != 0) {
            *(undefined1 *)((long)element + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            (**(code **)(*(long *)jsReentLock._24_8_ + 0x148))(jsReentLock._24_8_,uVar8,local_68,0);
            JsReentLock::MutateArrayObject((JsReentLock *)&element);
            *(undefined1 *)((long)element + 0x108) = 1;
          }
        }
        uVar8 = uVar8 + 1;
      } while (newLen != uVar8);
    }
  }
  else if (newLen != 0) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      if (*(undefined1 **)(&pSVar2[1].left + (ulong)start * 2) == &DAT_fff80002fff80002) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x187c,
                                    "(!SparseArraySegment<T>::IsMissingItem(&headSeg->elements[i+start]))"
                                    ,"Array marked incorrectly as having missing value");
        if (!bVar4) goto LAB_00ba717b;
        *puVar7 = 0;
      }
      start = start + 1;
      dstCount = dstCount - 1;
    } while (dstCount != 0);
  }
  *(undefined1 *)((long)element + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return;
}

Assistant:

void JavascriptArray::SliceHelper(JavascriptArray* pArr,  JavascriptArray* pnewArr, uint32 start, uint32 newLen)
    {
        JS_REENTRANCY_LOCK(jsReentLock, pArr->GetScriptContext()->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        SparseArraySegment<T>* headSeg = SparseArraySegment<T>::From(pArr->head);
        SparseArraySegment<T>* pnewHeadSeg = SparseArraySegment<T>::From(pnewArr->head);

        // Fill the newly created sliced array
        CopyArray(pnewHeadSeg->elements, newLen, headSeg->elements + start, newLen);
        pnewHeadSeg->length = newLen;
        pnewHeadSeg->CheckLengthvsSize();

        Assert(pnewHeadSeg->length <= pnewHeadSeg->size);
        // Prototype lookup for missing elements
        if (!pArr->HasNoMissingValues())
        {
            for (uint32 i = 0; i < newLen; i++)
            {
                if (!(pArr->head->left <= (i + start) && (i + start) <  (pArr->head->left + pArr->head->length)))
                {
                    break;
                }

                // array type might be changed in the below call to DirectGetItemAtFull
                // need recheck array type before checking array item [i + start]
                if (pArr->IsMissingItem(i + start))
                {
                    Var element;
                    pnewArr->SetHasNoMissingValues(false);
                    JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(i + start, &element));
                    if (gotItem)
                    {
                        JS_REENTRANT(jsReentLock, pnewArr->SetItem(i, element, PropertyOperation_None));
                    }
                }
            }
        }
#ifdef DBG
        else
        {
            for (uint32 i = 0; i < newLen; i++)
            {
                AssertMsg(!SparseArraySegment<T>::IsMissingItem(&headSeg->elements[i+start]), "Array marked incorrectly as having missing value");
            }
        }
#endif
    }

    // If the creating profile data has changed, convert it to the type of array indicated
    // in the profile
    void JavascriptArray::GetArrayTypeAndConvert(bool* isIntArray, bool* isFloatArray)
    {
        JavascriptNativeIntArray* nativeIntArray = JavascriptOperators::TryFromVar<JavascriptNativeIntArray>(this);
        if (nativeIntArray)
        {
#if ENABLE_PROFILE_INFO
            ArrayCallSiteInfo* info = nativeIntArray->GetArrayCallSiteInfo();
            if(!info || info->IsNativeIntArray())
            {
                *isIntArray = true;
            }
            else if(info->IsNativeFloatArray())
            {
                JavascriptNativeIntArray::ToNativeFloatArray(nativeIntArray);
                *isFloatArray = true;
            }
            else
            {
                JavascriptNativeIntArray::ToVarArray(nativeIntArray);
            }
#else
            *isIntArray = true;
#endif
        }
        else
        {
            JavascriptNativeFloatArray* nativeFloatArray = JavascriptOperators::TryFromVar<JavascriptNativeFloatArray>(this);
            if (nativeFloatArray)
            {
#if ENABLE_PROFILE_INFO
                ArrayCallSiteInfo* info = nativeFloatArray->GetArrayCallSiteInfo();

                if (info && !info->IsNativeArray())
                {
                    JavascriptNativeFloatArray::ToVarArray(nativeFloatArray);
                }
                else
                {
                    *isFloatArray = true;
                }
#else
                *isFloatArray = true;
#endif
            }
        }
    }

    Var JavascriptArray::EntrySlice(RecyclableObject* function, CallInfo callInfo, ...)
    {
        JIT_HELPER_REENTRANT_HEADER(Array_Slice);
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        Var res = scriptContext->GetLibrary()->GetUndefined();

        if (args.Info.Count == 0)
        {
            return res;
        }

        BigIndex length;
        JavascriptArray* pArr = nullptr;
        RecyclableObject* obj = nullptr;

        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.slice"), &pArr, &obj, &length));

        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceHelper(pArr, nullptr, obj, length.GetSmallIndex(), args, scriptContext));
        }

        Assert(pArr == nullptr || length.IsUint32Max());
        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceHelper(pArr, nullptr, obj, length.GetBigIndex(), args, scriptContext));
        JIT_HELPER_END(Array_Slice);
    }